

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_reporter.h
# Opt level: O0

string * __thiscall phyr::Timer::getFormattedTime_abi_cxx11_(Timer *this,uint64_t duration)

{
  string *in_RDI;
  int ss;
  int mm;
  int hh;
  string *formattedTime;
  char *in_stack_00000038;
  
  formatString<int,int,int>(in_stack_00000038,formattedTime._4_4_,(int)formattedTime,this._4_4_);
  return in_RDI;
}

Assistant:

std::string getFormattedTime(uint64_t duration) const {
        int hh, mm, ss;

        // Extract time components from given duration

        // Convert to seconds
        duration /= 1000;
        hh = duration / 3600; duration %= 3600;
        mm = duration / 60; duration %= 60;
        ss = duration;

        std::string formattedTime = formatString("%02d:%02d:%02d", hh, mm, ss);
        return formattedTime;
    }